

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Clear(BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *this)

{
  int **ppiVar1;
  SimpleHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> **ppSVar2;
  char *name;
  DictionaryStats *pDVar3;
  BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  if (0 < this->count) {
    ppiVar1 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
    memset(*ppiVar1,0xff,(ulong)this->bucketCount << 2);
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                        ((WriteBarrierPtr *)&this->entries);
    memset(*ppSVar2,0,(long)this->size << 4);
    this->count = 0;
    this->freeCount = 0;
    name = std::type_info::name
                     ((type_info *)
                      &BaseDictionary<void*,void*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>*
                       ::typeinfo);
    pDVar3 = DictionaryStats::Create(name,this->size);
    this->stats = pDVar3;
  }
  return;
}

Assistant:

void Clear()
        {
            if (count > 0)
            {
                memset(buckets, -1, bucketCount * sizeof(buckets[0]));
                memset(entries, 0, sizeof(EntryType) * size);
                count = 0;
                freeCount = 0;
#if PROFILE_DICTIONARY
                // To not loose previously collected data, we will treat cleared dictionary as a separate instance for stats tracking purpose
                stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
            }
        }